

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O0

void printf_btr_mcp251x(can_bittiming *bt,_Bool hdr)

{
  byte in_SIL;
  long in_RDI;
  uint8_t cnf3;
  uint8_t cnf2;
  uint8_t cnf1;
  
  if ((in_SIL & 1) == 0) {
    printf("0x%02x 0x%02x 0x%02x",
           (ulong)(byte)(((char)*(undefined4 *)(in_RDI + 0x18) + -1) * '@' |
                        (char)*(undefined4 *)(in_RDI + 0x1c) - 1U),
           (ulong)(byte)(((char)*(undefined4 *)(in_RDI + 0x10) + -1) * '\b' | 0x80U |
                        (char)*(undefined4 *)(in_RDI + 0xc) - 1U),
           (ulong)(byte)((char)*(undefined4 *)(in_RDI + 0x14) - 1));
  }
  else {
    printf("CNF1 CNF2 CNF3");
  }
  return;
}

Assistant:

static void printf_btr_mcp251x(struct can_bittiming *bt, bool hdr)
{
	uint8_t cnf1, cnf2, cnf3;

	if (hdr) {
		printf("CNF1 CNF2 CNF3");
	} else {
		cnf1 = ((bt->sjw - 1) << 6) | (bt->brp - 1);
		cnf2 = 0x80 | ((bt->phase_seg1 - 1) << 3) | (bt->prop_seg - 1);
		cnf3 = bt->phase_seg2 - 1;
		printf("0x%02x 0x%02x 0x%02x", cnf1, cnf2, cnf3);
	}
}